

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O0

bool __thiscall Memory::Recycler::HasPendingTrackObjects(Recycler *this)

{
  bool bVar1;
  bool local_11;
  Recycler *this_local;
  
  bVar1 = MarkContext::HasPendingTrackObjects(&this->markContext);
  local_11 = true;
  if (!bVar1) {
    bVar1 = MarkContext::HasPendingTrackObjects(&this->parallelMarkContext1);
    local_11 = true;
    if (!bVar1) {
      bVar1 = MarkContext::HasPendingTrackObjects(&this->parallelMarkContext2);
      local_11 = true;
      if (!bVar1) {
        local_11 = MarkContext::HasPendingTrackObjects(&this->parallelMarkContext3);
      }
    }
  }
  return local_11;
}

Assistant:

bool HasPendingTrackObjects() const { return markContext.HasPendingTrackObjects() || parallelMarkContext1.HasPendingTrackObjects() || parallelMarkContext2.HasPendingTrackObjects() || parallelMarkContext3.HasPendingTrackObjects(); }